

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void Decode85(uchar *src,uchar *dst)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined1 *in_RSI;
  char *in_RDI;
  uint tmp;
  undefined1 *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  for (local_8 = in_RDI; *local_8 != '\0'; local_8 = local_8 + 5) {
    uVar1 = Decode85Byte(*local_8);
    uVar2 = Decode85Byte(local_8[1]);
    uVar3 = Decode85Byte(local_8[2]);
    uVar4 = Decode85Byte(local_8[3]);
    uVar5 = Decode85Byte(local_8[4]);
    iVar6 = uVar1 + (uVar2 + (uVar3 + (uVar4 + uVar5 * 0x55) * 0x55) * 0x55) * 0x55;
    *local_10 = (char)iVar6;
    local_10[1] = (char)((uint)iVar6 >> 8);
    local_10[2] = (char)((uint)iVar6 >> 0x10);
    local_10[3] = (char)((uint)iVar6 >> 0x18);
    local_10 = local_10 + 4;
  }
  return;
}

Assistant:

static void         Decode85(const unsigned char* src, unsigned char* dst)
{
    while (*src)
    {
        unsigned int tmp = Decode85Byte(src[0]) + 85*(Decode85Byte(src[1]) + 85*(Decode85Byte(src[2]) + 85*(Decode85Byte(src[3]) + 85*Decode85Byte(src[4]))));
        dst[0] = ((tmp >> 0) & 0xFF); dst[1] = ((tmp >> 8) & 0xFF); dst[2] = ((tmp >> 16) & 0xFF); dst[3] = ((tmp >> 24) & 0xFF);   // We can't assume little-endianness.
        src += 5;
        dst += 4;
    }
}